

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

void __thiscall
Js::JSONStringifier::ReadData(JSONStringifier *this,RecyclableObject *valueObj,JSONProperty *prop)

{
  Type TVar1;
  code *pcVar2;
  double value;
  bool bVar3;
  BOOL BVar4;
  uint32 rhs;
  uint32 uVar5;
  undefined4 *puVar6;
  JavascriptTypedNumber<unsigned_long> *pJVar7;
  JavascriptString *ptr;
  JavascriptBoolean *pJVar8;
  JavascriptTypedNumber<long> *pJVar9;
  
  if (valueObj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a3cffd;
    *puVar6 = 0;
  }
  TVar1 = ((valueObj->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(valueObj), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) goto LAB_00a3cffd;
    *puVar6 = 0;
  }
  switch(TVar1) {
  case TypeIds_Null:
    SetNullProperty(this,prop);
    return;
  case TypeIds_Boolean:
    pJVar8 = UnsafeVarTo<Js::JavascriptBoolean,Js::RecyclableObject>(valueObj);
    if (pJVar8->value == 0) {
      prop->type = False;
      uVar5 = this->totalStringLength;
      rhs = 5;
    }
    else {
      prop->type = True;
      uVar5 = this->totalStringLength;
      rhs = 4;
    }
    goto LAB_00a3cfe5;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                ,0x305,"((0))","UNREACHED");
    if (!bVar3) {
LAB_00a3cffd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  case TypeIds_Undefined:
  case TypeIds_Symbol:
    prop->type = Undefined;
    break;
  case TypeIds_Int64Number:
    pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<long>,Js::RecyclableObject>(valueObj);
    value = (double)pJVar9->m_value;
    goto LAB_00a3cfbf;
  case TypeIds_LastNumberType:
    pJVar7 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>,Js::RecyclableObject>(valueObj);
    value = ((double)CONCAT44(0x43300000,(int)pJVar7->m_value) - 4503599627370496.0) +
            ((double)CONCAT44(0x45300000,(int)(pJVar7->m_value >> 0x20)) - 1.9342813113834067e+25);
LAB_00a3cfbf:
    SetNumericProperty(this,value,valueObj,prop);
    return;
  case TypeIds_String:
    ptr = UnsafeVarTo<Js::JavascriptString,Js::RecyclableObject>(valueObj);
    Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet
              ((WriteBarrierPtr<Js::JavascriptString> *)&(prop->field_1).numericValue,ptr);
    prop->type = String;
    uVar5 = this->totalStringLength;
    rhs = CalculateStringElementLength((JavascriptString *)(prop->field_1).numericValue.value.ptr);
LAB_00a3cfe5:
    uVar5 = UInt32Math::Add(uVar5,rhs);
    this->totalStringLength = uVar5;
  }
  return;
}

Assistant:

void
JSONStringifier::ReadData(_In_ RecyclableObject* valueObj, _Out_ JSONProperty* prop)
{
    TypeId typeId = JavascriptOperators::GetTypeId(valueObj);

    switch (typeId)
    {
    case TypeIds_Null:
        this->SetNullProperty(prop);
        return;

    case TypeIds_Boolean:
        if (UnsafeVarTo<JavascriptBoolean>(valueObj)->GetValue() != FALSE)
        {
            prop->type = JSONContentType::True;
            this->totalStringLength = UInt32Math::Add(this->totalStringLength, Constants::TrueStringLength);
        }
        else
        {
            prop->type = JSONContentType::False;
            this->totalStringLength = UInt32Math::Add(this->totalStringLength, Constants::FalseStringLength);
        }
        return;

    case TypeIds_Int64Number:
        this->SetNumericProperty(static_cast<double>(UnsafeVarTo<JavascriptInt64Number>(valueObj)->GetValue()), valueObj, prop);
        return;

    case TypeIds_UInt64Number:
        this->SetNumericProperty(static_cast<double>(UnsafeVarTo<JavascriptUInt64Number>(valueObj)->GetValue()), valueObj, prop);
        return;

#if !FLOATVAR
    case TypeIds_Number:
        this->SetNumericProperty(JavascriptNumber::GetValue(valueObj), valueObj, prop);
        return;
#endif

    case TypeIds_String:
        prop->stringValue = UnsafeVarTo<JavascriptString>(valueObj);
        prop->type = JSONContentType::String;
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, CalculateStringElementLength(prop->stringValue));
        return;

    case TypeIds_Symbol:
        // Treat symbols as undefined
    case TypeIds_Undefined:
        // If undefined is in an object, it is not included in the string, and if it is an array element it will show up as "null"
        // Given that, we can't caluclate the string length here and instead we do it at the usage points
        prop->type = JSONContentType::Undefined;
        return;

    default:
        Assert(UNREACHED);
        prop->type = JSONContentType::Undefined;
        return;
    }
}